

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O1

cdr * __thiscall neueda::cdr::operator=(cdr *this,cdr *obj)

{
  mapped_type *ppcVar1;
  _Rb_tree_node_base *p_Var2;
  
  if (this != obj) {
    this->mNextIndex = obj->mNextIndex;
    std::
    _Rb_tree<int,_std::pair<const_int,_neueda::cdrItem>,_std::_Select1st<std::pair<const_int,_neueda::cdrItem>_>,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
    ::operator=(&(this->mItems)._M_t,&(obj->mItems)._M_t);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_neueda::cdrItem_*>,_std::_Select1st<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>_>
    ::clear(&(this->mOrdered)._M_t);
    for (p_Var2 = (this->mItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->mItems)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      ppcVar1 = std::
                map<unsigned_int,_neueda::cdrItem_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>_>
                ::operator[](&this->mOrdered,(key_type *)((long)&p_Var2[1]._M_parent + 4));
      *ppcVar1 = (mapped_type)&p_Var2[1]._M_parent;
    }
  }
  return this;
}

Assistant:

cdr&
cdr::operator= (const cdr& obj)
{
    if (this != &obj)
    {
        mNextIndex = obj.mNextIndex;
        mItems = obj.mItems;

        mOrdered.clear ();
        for (itemMap::iterator itr = mItems.begin();
             itr != mItems.end();
             ++itr)
        {
            mOrdered[itr->second.mIndex] = &itr->second;
        }
    }

    return *this;
}